

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3FixExprList(DbFixer *pFix,ExprList *pList)

{
  int iVar1;
  ExprList_item *pEVar2;
  int iVar3;
  
  if (pList != (ExprList *)0x0) {
    pEVar2 = pList->a;
    for (iVar3 = 0; iVar3 < pList->nExpr; iVar3 = iVar3 + 1) {
      iVar1 = sqlite3FixExpr(pFix,pEVar2->pExpr);
      if (iVar1 != 0) {
        return 1;
      }
      pEVar2 = pEVar2 + 1;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixExprList(
  DbFixer *pFix,     /* Context of the fixation */
  ExprList *pList    /* The expression to be fixed to one database */
){
  int i;
  struct ExprList_item *pItem;
  if( pList==0 ) return 0;
  for(i=0, pItem=pList->a; i<pList->nExpr; i++, pItem++){
    if( sqlite3FixExpr(pFix, pItem->pExpr) ){
      return 1;
    }
  }
  return 0;
}